

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  string *psVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  int local_1fc8;
  string local_1cf0 [32];
  string local_1cd0 [32];
  string local_1cb0 [32];
  string local_1c90 [32];
  int local_1c70 [3];
  int local_1c64 [3];
  ulong local_1c58;
  size_t passProgress;
  ulong local_1c30;
  size_t newSize;
  long local_1c08;
  size_t oldSize;
  string local_1be0;
  string local_1bc0;
  undefined1 local_1ba0 [8];
  Reducer reducer;
  ulong uStack_19c8;
  bool stopping;
  size_t lastPostPassesSize;
  size_t lastDestructiveReductions;
  string local_19b0 [4];
  int factor;
  ulong local_1990;
  size_t workingSize;
  string local_1968 [39];
  allocator<char> local_1941;
  string local_1940;
  string local_1920;
  undefined1 local_1900 [8];
  ProgramResult result;
  string local_18c8;
  string local_18a8;
  undefined1 local_1888 [8];
  ProgramResult readWrite;
  string local_1850 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1790;
  undefined1 local_1770 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1730;
  Fatal local_1710;
  string local_1588;
  undefined1 local_1568 [8];
  ProgramResult resultOnValid;
  undefined1 local_1518 [8];
  ModuleWriter writer;
  Module emptyModule;
  undefined1 local_1090 [8];
  ProgramResult resultOnInvalid;
  ofstream dst;
  allocator<char> local_e59;
  string local_e58;
  anon_class_8_1_a7eb7a0b local_e38;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  string local_e10 [32];
  string local_df0 [32];
  Fatal local_dd0;
  Fatal local_c48;
  anon_class_8_1_a81546ea local_ac0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_ab8;
  allocator<char> local_a91;
  string local_a90 [39];
  anon_class_1_0_00000001 local_a69;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a68;
  allocator<char> local_a41;
  string local_a40 [39];
  allocator<char> local_a19;
  string local_a18 [39];
  allocator<char> local_9f1;
  string local_9f0 [39];
  anon_class_1_0_00000001 local_9c9;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9c8;
  allocator<char> local_9a1;
  string local_9a0 [39];
  allocator<char> local_979;
  string local_978 [39];
  allocator<char> local_951;
  string local_950 [39];
  anon_class_1_0_00000001 local_929;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_928;
  allocator<char> local_901;
  string local_900 [39];
  allocator<char> local_8d9;
  string local_8d8 [39];
  allocator<char> local_8b1;
  string local_8b0 [32];
  anon_class_8_1_a7eb7a0b local_890;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_888;
  allocator<char> local_861;
  string local_860 [39];
  allocator<char> local_839;
  string local_838 [39];
  allocator<char> local_811;
  string local_810 [32];
  anon_class_8_1_09c29441 local_7f0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7e8;
  allocator<char> local_7c1;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [32];
  anon_class_8_1_9847ac62 local_750;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_748;
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [32];
  anon_class_8_1_a7ca37fa local_6b0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_6a8;
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [32];
  anon_class_8_1_4e59fd3f local_610;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_608;
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [39];
  allocator<char> local_591;
  string local_590 [32];
  anon_class_8_1_4e598f44 local_570;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_568;
  allocator<char> local_541;
  string local_540 [39];
  allocator<char> local_519;
  string local_518 [39];
  allocator<char> local_4f1;
  string local_4f0 [32];
  anon_class_8_1_de425e11 local_4d0;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4c8;
  allocator<char> local_4a1;
  string local_4a0 [39];
  allocator<char> local_479;
  string local_478 [39];
  allocator<char> local_451;
  string local_450 [32];
  anon_class_8_1_8991f190 local_430;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_428;
  allocator<char> local_401;
  string local_400 [39];
  allocator<char> local_3d9;
  string local_3d8 [39];
  allocator<char> local_3b1;
  string local_3b0 [32];
  anon_class_8_1_bc00122b local_390;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_388;
  allocator<char> local_361;
  string local_360 [39];
  allocator<char> local_339;
  string local_338 [39];
  allocator<char> local_311;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  ToolOptions options;
  string local_118 [8];
  string WasmReduceOption;
  bool local_f0;
  bool local_ef;
  bool local_ee;
  bool local_ed [4];
  bool force;
  bool debugInfo;
  bool verbose;
  bool deNan;
  bool binary;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  string binDir;
  string command;
  string working;
  string test;
  string input;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(working.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(binDir.field_2._M_local_buf + 8));
  __s = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,__s,&local_d9);
  wasm::Path::getDirName((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_ed[0] = true;
  local_ee = false;
  local_ef = false;
  local_f0 = false;
  WasmReduceOption.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"wasm-reduce options",
             (allocator<char> *)((long)&options.disabledFeatures.features + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&options.disabledFeatures.features + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"wasm-reduce",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "Reduce a wasm file to a smaller one with the same behavior on a given command.\n\nTypical usage:\n\n  wasm-reduce orig.wasm \'--command=bash a.sh\' --test t.wasm --working w.wasm\n\nThe original file orig.wasm is where we begin. We then repeatedly test a small\nreduction of it by writing that modification to the \'test file\' (specified by\n\'--test\'), and we run the command, in this example \'bash a.sh\'. That command\nshould use the test file (and not the original file or any other one). Whenever\nthe reduction works, we write that new smaller file to the \'working file\'\n(specified by \'--working\'). The reduction \'works\' if it correctly preserves the\nbehavior of the command on the original input, specifically, that it has the\nsame stdout and the result return code. Each time reduction works we continue to\nreduce from that point (and each time it fails, we go back and try something\nelse).\n\nAs mentioned above, the command should run on the test file. That is, the first\nthing that wasm-reduce does on the example above is, effectively,\n\n  cp orig.wasm t.wasm\n  bash a.sh\n\nIn other words, it copies the original to the test file, and runs the command.\nWhatever the command does, we will preserve as we copy progressively smaller\nfiles to t.wasm. As we make progress, the smallest file will be written to\nthe working file, w.wasm, and when reduction is done you will find the final\nresult there.\n\nComparison to creduce:\n\n1. creduce requires the command to return 0. wasm-reduce is often used to reduce\n   crashes, which have non-zero return codes, so it is natural to allow any\n   return code. As mentioned above, we preserve the return code as we reduce.\n2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part\n   of the principle of preserving the original behavior of the command (if your\n   stdout varies in uninteresting ways, your command can be a script that runs\n   the real command and captures stdout to /dev/null, or filters it).\n3. creduce tramples the original input file as it reduces. wasm-reduce never\n   modifies th..." /* TRUNCATED STRING LITERAL */
             ,&local_2e9);
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_2a0,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_310,"--command",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"-cmd",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,&local_361);
  local_390.command = (string *)((long)&binDir.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_388,&local_390);
  psVar2 = (string *)
           wasm::Options::add((string *)&options,local_310,local_338,local_360,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_388,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"--test",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"-t",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,
             "Test file (this will be written to test, the given command should read it when we call it)"
             ,&local_401);
  local_430.test = (string *)((long)&working.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_428,&local_430);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_3b0,local_3d8,local_400,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_428,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_450,"--working",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_478,"-w",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,&local_4a1);
  local_4d0.working = (string *)((long)&command.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4c8,&local_4d0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_450,local_478,local_4a0,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_4c8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4f0,"--binaries",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_518,"-b",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,"binaryen binaries location (bin/ directory)",&local_541);
  local_570.binDir = (string *)local_b8;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_568,&local_570);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_4f0,local_518,local_540,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_568,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_590,"--text",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5b8,"-S",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,&local_5e1);
  local_610.binary = local_ed;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_608,&local_610);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_590,local_5b8,local_5e0,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_608,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_630,"--denan",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_658,"",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,"Avoid nans when reducing",&local_681);
  local_6b0.deNan = &local_ee;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_6a8,&local_6b0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_630,local_658,local_680,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_6a8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,"--verbose",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6f8,"-v",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_720,"Verbose output mode",&local_721);
  local_750.verbose = &local_ef;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_748,&local_750);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_6d0,local_6f8,local_720,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_748,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_770,"--debugInfo",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_798,"-g",&local_799);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7c0,"Keep debug info in binaries",&local_7c1);
  local_7f0.debugInfo = &local_f0;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7e8,&local_7f0);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_770,local_798,local_7c0,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_7e8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_810,"--force",&local_811);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_838,"-f",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_860,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             &local_861);
  local_890.force = (bool *)((long)&WasmReduceOption.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_888,&local_890);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_810,local_838,local_860,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_888,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8b0,"--timeout",&local_8b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d8,"-to",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_900,
             "A timeout to apply to each execution of the command, in seconds (default: 2)",
             &local_901);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__9,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_928,&local_929);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_8b0,local_8d8,local_900,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_928,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_950,"--extra-flags",&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_978,"-ef",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9a0,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             &local_9a1);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__10,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9c8,&local_9c9);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_950,local_978,local_9a0,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_9c8,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9f0,"--save-all-working",&local_9f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a18,"-saw",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a40,"Save all intermediate working files, as $WORKING.0, .1, .2 etc",&local_a41);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__11,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a68,&local_a69);
  psVar2 = (string *)
           wasm::Options::add(psVar2,local_9f0,local_a18,local_a40,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_a68,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a90,"INFILE",&local_a91);
  local_ac0.input = (string *)((long)&test.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__12,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_ab8,&local_ac0);
  wasm::Options::add_positional(psVar2,(Arguments)local_a90,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_ab8);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a68);
  std::__cxx11::string::~string(local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator(&local_a19);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9c8);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_928);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_888);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator(&local_839);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator(&local_811);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7e8);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_748);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_6a8);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_608);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator(&local_591);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_568);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4c8);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator(&local_451);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_428);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_388);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator(&local_311);
  wasm::Options::parse((int)&options,(char **)(ulong)(uint)argc);
  if ((local_f0 & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)&extraFlags_abi_cxx11_," -g ");
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    wasm::Fatal::Fatal(&local_c48);
    wasm::Fatal::operator<<(&local_c48,(char (*) [24])"test file not provided\n");
    wasm::Fatal::~Fatal(&local_c48);
  }
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    wasm::Fatal::Fatal(&local_dd0);
    wasm::Fatal::operator<<(&local_dd0,(char (*) [27])"working file not provided\n");
    wasm::Fatal::~Fatal(&local_dd0);
  }
  if ((local_ed[0] & 1U) == 0) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)local_b8);
  std::operator<<((ostream *)&std::cerr,"|wasm-reduce\n");
  poVar4 = std::operator<<((ostream *)&std::cerr,"|input: ");
  poVar4 = std::operator<<(poVar4,(string *)(test.field_2._M_local_buf + 8));
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cerr,"|test: ");
  poVar4 = std::operator<<(poVar4,(string *)(working.field_2._M_local_buf + 8));
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cerr,"|working: ");
  poVar4 = std::operator<<(poVar4,(string *)(command.field_2._M_local_buf + 8));
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cerr,"|bin dir: ");
  poVar4 = std::operator<<(poVar4,(string *)local_b8);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cerr,"|extra flags: ");
  poVar4 = std::operator<<(poVar4,(string *)&extraFlags_abi_cxx11_);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::string(local_df0,(string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_e10,(string *)(working.field_2._M_local_buf + 8));
  wasm::copy_file(local_df0,local_e10);
  std::__cxx11::string::~string(local_e10);
  std::__cxx11::string::~string(local_df0);
  std::__cxx11::string::string
            ((string *)&stopIfNotForced,(string *)(binDir.field_2._M_local_buf + 8));
  ProgramResult::getFromExecution(&expected,(string *)&stopIfNotForced);
  std::__cxx11::string::~string((string *)&stopIfNotForced);
  poVar4 = std::operator<<((ostream *)&std::cerr,"|expected result:\n");
  poVar4 = std::operator<<(poVar4,&expected);
  std::operator<<(poVar4,'\n');
  std::operator<<((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n");
  local_e38.force = (bool *)((long)&WasmReduceOption.field_2 + 0xf);
  auVar7._8_4_ = (int)(timeout >> 0x20);
  auVar7._0_8_ = timeout;
  auVar7._12_4_ = 0x45300000;
  if ((auVar7._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e58,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,&local_e59);
    main::anon_class_8_1_a7eb7a0b::operator()(&local_e38,&local_e58,&expected);
    std::__cxx11::string::~string((string *)&local_e58);
    std::allocator<char>::~allocator(&local_e59);
  }
  if ((WasmReduceOption.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
                   );
    std::ofstream::ofstream
              (&resultOnInvalid.time,(string *)(working.field_2._M_local_buf + 8),_S_bin);
    std::operator<<((ostream *)&resultOnInvalid.time,"waka waka\n");
    std::ofstream::~ofstream(&resultOnInvalid.time);
    std::__cxx11::string::string
              ((string *)&emptyModule.tagsMap._M_h._M_single_bucket,
               (string *)(binDir.field_2._M_local_buf + 8));
    ProgramResult::ProgramResult
              ((ProgramResult *)local_1090,(string *)&emptyModule.tagsMap._M_h._M_single_bucket);
    std::__cxx11::string::~string((string *)&emptyModule.tagsMap._M_h._M_single_bucket);
    bVar1 = ProgramResult::operator==((ProgramResult *)local_1090,&expected);
    if (bVar1) {
      wasm::Module::Module((Module *)((long)&writer.sourceMapUrl.field_2 + 8));
      wasm::ModuleWriter::ModuleWriter
                ((ModuleWriter *)local_1518,(PassOptions *)&options.field_0xb0);
      wasm::ModuleWriter::setBinary((ModuleWriter *)local_1518,true);
      std::__cxx11::string::string
                ((string *)&resultOnValid.time,(string *)(working.field_2._M_local_buf + 8));
      wasm::ModuleWriter::write
                (local_1518,(undefined1 *)((long)&writer.sourceMapUrl.field_2 + 8),
                 &resultOnValid.time);
      std::__cxx11::string::~string((string *)&resultOnValid.time);
      std::__cxx11::string::string
                ((string *)&local_1588,(string *)(binDir.field_2._M_local_buf + 8));
      ProgramResult::ProgramResult((ProgramResult *)local_1568,&local_1588);
      std::__cxx11::string::~string((string *)&local_1588);
      bVar1 = ProgramResult::operator==((ProgramResult *)local_1568,&expected);
      if (bVar1) {
        wasm::Fatal::Fatal(&local_1710);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmd.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&working.field_2 + 8));
        std::operator+(&local_1730,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmd.field_2 + 8),")? (use -f to ignore this check)");
        wasm::Fatal::operator<<(&local_1710,&local_1730);
        std::__cxx11::string::~string((string *)&local_1730);
        std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal(&local_1710);
      }
      ProgramResult::~ProgramResult((ProgramResult *)local_1568);
      wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_1518);
      wasm::Module::~Module((Module *)((long)&writer.sourceMapUrl.field_2 + 8));
    }
    ProgramResult::~ProgramResult((ProgramResult *)local_1090);
  }
  std::operator<<((ostream *)&std::cerr,
                  "|checking that command has expected behavior on canonicalized (read-written) binary\n"
                 );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1850,"wasm-opt",(allocator<char> *)((long)&readWrite.time + 7));
  wasm::Path::getBinaryenBinaryTool((string *)&local_1830);
  std::operator+(&local_1810,&local_1830," ");
  std::operator+(&local_17f0,&local_1810,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&test.field_2 + 8));
  std::operator+(&local_17d0,&local_17f0," -o ");
  std::operator+(&local_17b0,&local_17d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&working.field_2 + 8));
  std::operator+(&local_1790,&local_17b0," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1770,
                 &local_1790,&extraFlags_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1790);
  std::__cxx11::string::~string((string *)&local_17b0);
  std::__cxx11::string::~string((string *)&local_17d0);
  std::__cxx11::string::~string((string *)&local_17f0);
  std::__cxx11::string::~string((string *)&local_1810);
  std::__cxx11::string::~string((string *)&local_1830);
  std::__cxx11::string::~string(local_1850);
  std::allocator<char>::~allocator((allocator<char> *)((long)&readWrite.time + 7));
  if ((local_ed[0] & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)local_1770," -S ");
  }
  std::__cxx11::string::string((string *)&local_18a8,(string *)local_1770);
  ProgramResult::ProgramResult((ProgramResult *)local_1888,&local_18a8);
  std::__cxx11::string::~string((string *)&local_18a8);
  bVar1 = ProgramResult::failed((ProgramResult *)local_1888);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_18c8,"failed to read and write the binary",
               (allocator<char> *)((long)&result.time + 7));
    main::anon_class_8_1_a7eb7a0b::operator()(&local_e38,&local_18c8,(ProgramResult *)local_1888);
    std::__cxx11::string::~string((string *)&local_18c8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&result.time + 7));
  }
  else {
    std::__cxx11::string::string((string *)&local_1920,(string *)(binDir.field_2._M_local_buf + 8));
    ProgramResult::ProgramResult((ProgramResult *)local_1900,&local_1920);
    std::__cxx11::string::~string((string *)&local_1920);
    bVar1 = ProgramResult::operator!=((ProgramResult *)local_1900,&expected);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1940,
                 "running command on the canonicalized module should give the same results",
                 &local_1941);
      main::anon_class_8_1_a7eb7a0b::operator()(&local_e38,&local_1940,(ProgramResult *)local_1900);
      std::__cxx11::string::~string((string *)&local_1940);
      std::allocator<char>::~allocator(&local_1941);
    }
    ProgramResult::~ProgramResult((ProgramResult *)local_1900);
  }
  ProgramResult::~ProgramResult((ProgramResult *)local_1888);
  std::__cxx11::string::~string((string *)local_1770);
  std::__cxx11::string::string(local_1968,(string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&workingSize,(string *)(command.field_2._M_local_buf + 8));
  wasm::copy_file(local_1968,&workingSize);
  std::__cxx11::string::~string((string *)&workingSize);
  std::__cxx11::string::~string(local_1968);
  std::__cxx11::string::string(local_19b0,(string *)(command.field_2._M_local_buf + 8));
  uVar5 = wasm::file_size(local_19b0);
  std::__cxx11::string::~string(local_19b0);
  local_1990 = uVar5;
  poVar4 = std::operator<<((ostream *)&std::cerr,"|input size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1990);
  std::operator<<(poVar4,"\n");
  std::operator<<((ostream *)&std::cerr,"|starting reduction!\n");
  if ((local_ed[0] & 1U) == 0) {
    local_1fc8 = (int)(local_1990 / 10);
  }
  else {
    local_1fc8 = (int)(local_1990 << 1);
  }
  lastDestructiveReductions._4_4_ = local_1fc8;
  lastPostPassesSize = 0;
  uStack_19c8 = 0;
  reducer.decisionCounter._7_1_ = 0;
  do {
    std::__cxx11::string::string((string *)&local_1bc0,(string *)(binDir.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_1be0,(string *)(working.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::string((string *)&oldSize,(string *)(command.field_2._M_local_buf + 8));
    Reducer::Reducer((Reducer *)local_1ba0,&local_1bc0,&local_1be0,(string *)&oldSize,
                     (bool)(local_ed[0] & 1),(bool)(local_ee & 1),(bool)(local_ef & 1),
                     (bool)(local_f0 & 1),(ToolOptions *)local_2a0);
    std::__cxx11::string::~string((string *)&oldSize);
    std::__cxx11::string::~string((string *)&local_1be0);
    std::__cxx11::string::~string((string *)&local_1bc0);
    std::operator<<((ostream *)&std::cerr,"|  reduce using passes...\n");
    std::__cxx11::string::string((string *)&newSize,(string *)(command.field_2._M_local_buf + 8));
    lVar3 = wasm::file_size(&newSize);
    std::__cxx11::string::~string((string *)&newSize);
    local_1c08 = lVar3;
    Reducer::reduceUsingPasses((Reducer *)local_1ba0);
    std::__cxx11::string::string
              ((string *)&passProgress,(string *)(command.field_2._M_local_buf + 8));
    uVar5 = wasm::file_size(&passProgress);
    std::__cxx11::string::~string((string *)&passProgress);
    local_1c58 = local_1c08 - uVar5;
    local_1c30 = uVar5;
    poVar4 = std::operator<<((ostream *)&std::cerr,"|  after pass reduction: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c30);
    std::operator<<(poVar4,"\n");
    if ((reducer.decisionCounter._7_1_ & 1) == 0) {
      if ((uStack_19c8 != 0) && (uStack_19c8 <= local_1c30)) {
        std::operator<<((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n");
        if (lastDestructiveReductions._4_4_ == 1) {
          reducer.decisionCounter._7_1_ = 1;
        }
        else {
          lastDestructiveReductions._4_4_ = (lastDestructiveReductions._4_4_ + 1) / 2;
        }
      }
      uStack_19c8 = local_1c30;
      poVar4 = std::operator<<((ostream *)&std::cerr,"|  pass progress: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1c58);
      poVar4 = std::operator<<(poVar4,", last destructive: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,lastPostPassesSize);
      std::operator<<(poVar4,'\n');
      if (local_1c58 < lastPostPassesSize << 2) {
        if (lastDestructiveReductions._4_4_ < 0xb) {
          lastDestructiveReductions._4_4_ = (lastDestructiveReductions._4_4_ + 1) / 2;
        }
        else {
          lastDestructiveReductions._4_4_ = lastDestructiveReductions._4_4_ / 3 + 1;
        }
      }
      else {
        std::operator<<((ostream *)&std::cerr,
                        "|  progress is good, do not quickly decrease factor\n");
        local_1c64[1] = 1;
        local_1c64[0] = (lastDestructiveReductions._4_4_ * 9) / 10;
        piVar6 = std::max<int>(local_1c64 + 1,local_1c64);
        lastDestructiveReductions._4_4_ = *piVar6;
      }
      if (local_1c30 < 5) {
        __assert_fail("newSize > 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                      ,0x624,"int main(int, const char **)");
      }
      local_1c70[2] = (int)local_1c30;
      if ((int)local_1c30 < 0) {
        local_1c70[2] = (int)local_1c30 + 3;
      }
      local_1c70[2] = local_1c70[2] >> 2;
      piVar6 = std::min<int>((int *)((long)&lastDestructiveReductions + 4),local_1c70 + 2);
      lastDestructiveReductions._4_4_ = *piVar6;
      while( true ) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|  reduce destructively... (factor: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,lastDestructiveReductions._4_4_);
        std::operator<<(poVar4,")\n");
        lastPostPassesSize =
             Reducer::reduceDestructively((Reducer *)local_1ba0,lastDestructiveReductions._4_4_);
        if (lastPostPassesSize != 0) break;
        if (lastDestructiveReductions._4_4_ == 1) {
          reducer.decisionCounter._7_1_ = 1;
          break;
        }
        local_1c70[1] = 1;
        local_1c70[0] = lastDestructiveReductions._4_4_;
        if (lastDestructiveReductions._4_4_ < 0) {
          local_1c70[0] = lastDestructiveReductions._4_4_ + 3;
        }
        local_1c70[0] = local_1c70[0] >> 2;
        piVar6 = std::max<int>(local_1c70 + 1,local_1c70);
        lastDestructiveReductions._4_4_ = *piVar6;
      }
      poVar4 = std::operator<<((ostream *)&std::cerr,"|  destructive reduction led to size: ");
      std::__cxx11::string::string(local_1c90,(string *)(command.field_2._M_local_buf + 8));
      uVar5 = wasm::file_size(local_1c90);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string(local_1c90);
      local_1c64[2] = 0;
    }
    else {
      local_1c64[2] = 3;
    }
    Reducer::~Reducer((Reducer *)local_1ba0);
    if (local_1c64[2] != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"|finished, final size: ");
      std::__cxx11::string::string(local_1cb0,(string *)(command.field_2._M_local_buf + 8));
      uVar5 = wasm::file_size(local_1cb0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string(local_1cb0);
      std::__cxx11::string::string(local_1cd0,(string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_1cf0,(string *)(working.field_2._M_local_buf + 8));
      wasm::copy_file(local_1cd0,local_1cf0);
      std::__cxx11::string::~string(local_1cf0);
      std::__cxx11::string::~string(local_1cd0);
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_2a0);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)(binDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options(
    "wasm-reduce",
    R"(Reduce a wasm file to a smaller one with the same behavior on a given command.

Typical usage:

  wasm-reduce orig.wasm '--command=bash a.sh' --test t.wasm --working w.wasm

The original file orig.wasm is where we begin. We then repeatedly test a small
reduction of it by writing that modification to the 'test file' (specified by
'--test'), and we run the command, in this example 'bash a.sh'. That command
should use the test file (and not the original file or any other one). Whenever
the reduction works, we write that new smaller file to the 'working file'
(specified by '--working'). The reduction 'works' if it correctly preserves the
behavior of the command on the original input, specifically, that it has the
same stdout and the result return code. Each time reduction works we continue to
reduce from that point (and each time it fails, we go back and try something
else).

As mentioned above, the command should run on the test file. That is, the first
thing that wasm-reduce does on the example above is, effectively,

  cp orig.wasm t.wasm
  bash a.sh

In other words, it copies the original to the test file, and runs the command.
Whatever the command does, we will preserve as we copy progressively smaller
files to t.wasm. As we make progress, the smallest file will be written to
the working file, w.wasm, and when reduction is done you will find the final
result there.

Comparison to creduce:

1. creduce requires the command to return 0. wasm-reduce is often used to reduce
   crashes, which have non-zero return codes, so it is natural to allow any
   return code. As mentioned above, we preserve the return code as we reduce.
2. creduce ignores stdout. wasm-reduce preserves stdout as it reduces, as part
   of the principle of preserving the original behavior of the command (if your
   stdout varies in uninteresting ways, your command can be a script that runs
   the real command and captures stdout to /dev/null, or filters it).
3. creduce tramples the original input file as it reduces. wasm-reduce never
   modifies the input (to avoid mistakes that cause data loss). Instead,
   when reductions work we write to the 'working file' as mentioned above, and
   the final reduction will be there.
4. creduce runs the command in a temp directory. That is safer in general, but
   it is not how the original command ran, and in particular forces additional
   work if you have multiple files (which, for wasm-reduce, is common, e.g. if
   the testcase is a combination of JavaScript and wasm). wasm-reduce runs the
   command in the current directory (of course, your command can be a script
   that changes directory to anywhere else).

More documentation can be found at

  https://github.com/WebAssembly/binaryen/wiki/Fuzzing#reducing
                      )");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add("--save-all-working",
         "-saw",
         "Save all intermediate working files, as $WORKING.0, .1, .2 etc",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) {
           saveAllWorkingFiles = true;
           std::cout << "|saving all intermediate working files\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer(options.passOptions);
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}